

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OperationsBuilder.cpp
# Opt level: O2

void __thiscall
Refal2::COperationsBuilder::AddMatchLeft_W
          (COperationsBuilder *this,CQualifier *qualifier,bool saveInTable)

{
  bool bVar1;
  
  bVar1 = CQualifier::IsEmpty(qualifier);
  if (bVar1) {
    addOperation(this,saveInTable + OT_MatchLeft_W);
    return;
  }
  addQualifierIndexOperation(this,saveInTable + OT_MatchLeftWithQualifier_W,qualifier);
  return;
}

Assistant:

void COperationsBuilder::AddMatchLeft_W( CQualifier& qualifier,
	bool saveInTable )
{
	DEBUG_PRINT( __FUNCTION__ )
	if( qualifier.IsEmpty() ) {
		addNoArgumensOperation(
			( saveInTable ? OT_MatchLeftSaveToTable_W : OT_MatchLeft_W ) );
	} else {
		addQualifierIndexOperation(
			( saveInTable ? OT_MatchLeftWithQualifierSaveToTable_W :
			OT_MatchLeftWithQualifier_W ), qualifier );
	}
}